

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm.h
# Opt level: O2

void ncnn::conv_im2col_sgemm_transform_kernel_sse
               (Mat *_kernel,Mat *kernel_tm,int inch,int outch,int kernel_size)

{
  void *pvVar1;
  void *pvVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  undefined4 *puVar12;
  int iVar13;
  Mat local_70;
  
  pvVar1 = _kernel->data;
  uVar11 = 0;
  Mat::create(kernel_tm,kernel_size * 4,inch,(outch / 4) * -3 + outch,4,(Allocator *)0x0);
  iVar3 = kernel_size * inch;
  iVar13 = 0;
  if (0 < iVar3) {
    iVar13 = iVar3;
  }
  uVar6 = (ulong)(uint)(outch >> 2);
  if (outch >> 2 < 1) {
    uVar6 = uVar11;
  }
  iVar5 = iVar3 * 4;
  iVar10 = iVar3 * 2;
  iVar8 = iVar3 * 3;
  iVar9 = iVar3;
  for (uVar7 = 0; uVar7 != uVar6; uVar7 = uVar7 + 1) {
    Mat::channel(&local_70,kernel_tm,(int)uVar7);
    puVar12 = (undefined4 *)local_70.data;
    Mat::~Mat(&local_70);
    for (lVar4 = 0; iVar13 != (int)lVar4; lVar4 = lVar4 + 1) {
      *puVar12 = *(undefined4 *)((long)pvVar1 + lVar4 * 4 + (long)(int)uVar11 * 4);
      puVar12[1] = *(undefined4 *)((long)pvVar1 + lVar4 * 4 + (long)iVar9 * 4);
      puVar12[2] = *(undefined4 *)((long)pvVar1 + lVar4 * 4 + (long)iVar10 * 4);
      puVar12[3] = *(undefined4 *)((long)pvVar1 + lVar4 * 4 + (long)iVar8 * 4);
      puVar12 = puVar12 + 4;
    }
    uVar11 = (ulong)(uint)((int)uVar11 + iVar5);
    iVar9 = iVar9 + iVar5;
    iVar10 = iVar10 + iVar5;
    iVar8 = iVar8 + iVar5;
  }
  iVar8 = ((uint)outch >> 2) * kernel_size * inch * 4;
  for (uVar11 = (ulong)(int)(outch & 0xfffffffc); (long)uVar11 < (long)outch; uVar11 = uVar11 + 1) {
    uVar6 = (ulong)(uint)((int)uVar11 >> 0x1f) << 0x20 | uVar11 & 0xffffffff;
    Mat::channel(&local_70,kernel_tm,(int)((long)uVar6 % 4) + (int)((long)uVar6 / 4));
    pvVar2 = local_70.data;
    Mat::~Mat(&local_70);
    for (lVar4 = 0; iVar13 != (int)lVar4; lVar4 = lVar4 + 1) {
      *(undefined4 *)((long)pvVar2 + lVar4 * 4) =
           *(undefined4 *)((long)pvVar1 + lVar4 * 4 + (long)iVar8 * 4);
    }
    iVar8 = iVar8 + iVar3;
  }
  return;
}

Assistant:

static void conv_im2col_sgemm_transform_kernel_sse(const Mat& _kernel, Mat& kernel_tm, int inch, int outch, int kernel_size)
{
    const float* kernel = _kernel;

    // kernel memory packed 4 x 4
    kernel_tm.create(4*kernel_size, inch, outch/4 + outch%4);
    
    int nn_outch = 0;
    int remain_outch_start = 0;

    nn_outch = outch >> 2;
    remain_outch_start = nn_outch << 2;

    for (int pp=0; pp<nn_outch; pp++)
    {
        int p = pp * 4;

        const float* k0 = kernel + (p+0)*inch*kernel_size;
        const float* k1 = kernel + (p+1)*inch*kernel_size;
        const float* k2 = kernel + (p+2)*inch*kernel_size;
        const float* k3 = kernel + (p+3)*inch*kernel_size;

        float* ktmp = kernel_tm.channel(p/4);

        for (int q=0; q<inch*kernel_size; q++)
        {
            ktmp[0] = k0[0];
            ktmp[1] = k1[0];
            ktmp[2] = k2[0];
            ktmp[3] = k3[0];
            ktmp += 4;

            k0 += 1;
            k1 += 1;
            k2 += 1;
            k3 += 1;
        }
    }
    
    for (int p=remain_outch_start; p<outch; p++)
    {
        const float* k0 = kernel + (p+0)*inch*kernel_size;

        float* ktmp = kernel_tm.channel(p/4 + p%4);

        for (int q=0; q<inch*kernel_size; q++)
        {
            ktmp[0] = k0[0];
            ktmp++;
            k0++;
        }
    }
}